

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void embree::errorFunc(int error,char *description)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Error: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_68);
  local_48 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_48 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void errorFunc(int error, const char* description) {
    throw std::runtime_error(std::string("Error: ")+description);
  }